

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O1

PVG_FT_Error PVG_FT_Outline_Check(PVG_FT_Outline *outline)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  if (outline != (PVG_FT_Outline *)0x0) {
    uVar1 = outline->n_contours;
    iVar2 = outline->n_points;
    if (iVar2 == 0 && uVar1 == 0) {
      return 0;
    }
    if (0 < (int)uVar1 && 0 < iVar2) {
      uVar5 = 0;
      iVar4 = -1;
      do {
        iVar3 = outline->contours[uVar5];
        if (iVar3 <= iVar4) {
          return -1;
        }
        if (iVar2 <= iVar3) {
          return -1;
        }
        uVar5 = uVar5 + 1;
        iVar4 = iVar3;
      } while (uVar1 != uVar5);
      if (iVar3 == iVar2 + -1) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

PVG_FT_Error PVG_FT_Outline_Check(PVG_FT_Outline* outline)
{
    if (outline) {
        PVG_FT_Int n_points = outline->n_points;
        PVG_FT_Int n_contours = outline->n_contours;
        PVG_FT_Int end0, end;
        PVG_FT_Int n;

        /* empty glyph? */
        if (n_points == 0 && n_contours == 0) return 0;

        /* check point and contour counts */
        if (n_points <= 0 || n_contours <= 0) goto Bad;

        end0 = end = -1;
        for (n = 0; n < n_contours; n++) {
            end = outline->contours[n];

            /* note that we don't accept empty contours */
            if (end <= end0 || end >= n_points) goto Bad;

            end0 = end;
        }

        if (end != n_points - 1) goto Bad;

        /* XXX: check the tags array */
        return 0;
    }

Bad:
    return ErrRaster_Invalid_Outline;
}